

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

int write_code(char *s,char *t)

{
  bool bVar1;
  Fl_Type *pFVar2;
  id *piVar3;
  included *piVar4;
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  long lVar8;
  char *pcVar9;
  bool local_101;
  char local_f1;
  int y;
  int x;
  Fl_Type *last_type;
  Fl_Type *q;
  Fl_Type *p;
  char *b;
  char *a;
  char define_name [102];
  char *hdr;
  Fl_Type *first_type;
  FILE *f_1;
  FILE *f;
  char *filemode;
  char *t_local;
  char *s_local;
  
  piVar3 = id_root;
  f = (FILE *)0x289c71;
  if (write_sourceview != 0) {
    f = (FILE *)anon_var_dwarf_22a49;
  }
  write_number = write_number + 1;
  if (id_root != (id *)0x0) {
    id::~id(id_root);
    operator_delete(piVar3,0x20);
  }
  id_root = (id *)0x0;
  indentation = 0;
  current_class = (Fl_Class_Type *)0x0;
  current_widget_class = (Fl_Widget_Class_Type *)0x0;
  if (s == (char *)0x0) {
    code_file = _stdout;
    pFVar7 = code_file;
  }
  else {
    pFVar7 = fl_fopen(s,(char *)f);
    if (pFVar7 == (FILE *)0x0) {
      return 0;
    }
  }
  code_file = pFVar7;
  if (t == (char *)0x0) {
    header_file = _stdout;
    pFVar7 = header_file;
  }
  else {
    pFVar7 = fl_fopen(t,(char *)f);
    if (pFVar7 == (FILE *)0x0) {
      fclose((FILE *)code_file);
      return 0;
    }
  }
  header_file = pFVar7;
  pFVar2 = Fl_Type::first;
  hdr = (char *)Fl_Type::first;
  if ((Fl_Type::first != (Fl_Type *)0x0) &&
     (iVar5 = (*Fl_Type::first->_vptr_Fl_Type[0x25])(), iVar5 != 0)) {
    if (write_sourceview != 0) {
      lVar8 = ftell((FILE *)code_file);
      pFVar2->code_position = (int)lVar8;
      lVar8 = ftell((FILE *)header_file);
      pFVar2->header_position = (int)lVar8;
    }
    (*pFVar2->_vptr_Fl_Type[0x11])();
    if (write_sourceview != 0) {
      lVar8 = ftell((FILE *)code_file);
      pFVar2->code_position_end = (int)lVar8;
      lVar8 = ftell((FILE *)header_file);
      pFVar2->header_position_end = (int)lVar8;
    }
    hdr = (char *)pFVar2->next;
  }
  fprintf((FILE *)header_file,
          "// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n",
          0x3ff07c84b5dcc63f);
  fprintf((FILE *)code_file,
          "// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n",
          0x3ff07c84b5dcc63f);
  b = fl_filename_name(t);
  p = (Fl_Type *)&a;
  iVar5 = isalpha((int)*b);
  if (iVar5 == 0) {
    p = (Fl_Type *)((long)&a + 1);
    a._0_1_ = 0x5f;
  }
  for (; *b != '\0'; b = b + 1) {
    iVar5 = isalnum((int)*b);
    if (iVar5 == 0) {
      local_f1 = '_';
    }
    else {
      local_f1 = *b;
    }
    *(char *)&p->_vptr_Fl_Type = local_f1;
    p = (Fl_Type *)((long)&p->_vptr_Fl_Type + 1);
  }
  *(undefined1 *)&p->_vptr_Fl_Type = 0;
  fprintf((FILE *)header_file,"#ifndef %s\n",&a);
  fprintf((FILE *)header_file,"#define %s\n",&a);
  write_declare("#include <FL/Fl.H>");
  if ((i18n_type != 0) && (*i18n_include != '\0')) {
    if ((*i18n_include == '<') || (*i18n_include == '\"')) {
      write_c("#include %s\n",i18n_include);
    }
    else {
      write_c("#include \"%s\"\n",i18n_include);
    }
    if (i18n_type == 2) {
      if (*i18n_file == '\0') {
        write_c("// Initialize I18N stuff now for menus...\n");
        write_c("#include <locale.h>\n");
        write_c("static char *_locale = setlocale(LC_MESSAGES, \"\");\n");
        write_c("static nl_catd _catalog = catopen(\"%s\", 0);\n",i18n_program);
      }
      else {
        write_c("extern nl_catd %s;\n",i18n_file);
      }
    }
  }
  if ((t != (char *)0x0) && (include_H_from_C != 0)) {
    if ((*header_file_name == '.') &&
       (pcVar9 = strchr(header_file_name,0x2f), pcVar9 == (char *)0x0)) {
      pcVar9 = fl_filename_name(t);
      write_c("#include \"%s\"\n",pcVar9);
    }
    else {
      write_c("#include \"%s\"\n",t);
    }
  }
  for (q = (Fl_Type *)hdr; piVar4 = included_root, q != (Fl_Type *)0x0; q = write_code(q)) {
    if (write_sourceview != 0) {
      lVar8 = ftell((FILE *)header_file);
      q->header_position = (int)lVar8;
    }
    (*q->_vptr_Fl_Type[0x10])();
    if (write_sourceview != 0) {
      lVar8 = ftell((FILE *)header_file);
      q->header_position_end = (int)lVar8;
      if (q->header_position == q->header_position_end) {
        q->header_position_end = -1;
      }
    }
    last_type = q->next;
    while( true ) {
      bVar1 = false;
      if (last_type != (Fl_Type *)0x0) {
        bVar1 = q->level < last_type->level;
      }
      if (!bVar1) break;
      if (write_sourceview != 0) {
        lVar8 = ftell((FILE *)header_file);
        last_type->header_position = (int)lVar8;
      }
      (*last_type->_vptr_Fl_Type[0x10])();
      if (write_sourceview != 0) {
        lVar8 = ftell((FILE *)header_file);
        last_type->header_position_end = (int)lVar8;
        if (last_type->header_position == last_type->header_position_end) {
          last_type->header_position_end = -1;
        }
      }
      last_type = last_type->next;
    }
  }
  if (included_root != (included *)0x0) {
    included::~included(included_root);
    operator_delete(piVar4,0x18);
  }
  included_root = (included *)0x0;
  if (s == (char *)0x0) {
    s_local._4_4_ = 1;
  }
  else {
    fprintf((FILE *)header_file,"#endif\n");
    pFVar2 = Fl_Type::last;
    if ((Fl_Type::last != (Fl_Type *)0x0) &&
       (iVar5 = (*Fl_Type::last->_vptr_Fl_Type[0x25])(), iVar5 != 0)) {
      if (write_sourceview != 0) {
        lVar8 = ftell((FILE *)code_file);
        pFVar2->code_position = (int)lVar8;
        lVar8 = ftell((FILE *)header_file);
        pFVar2->header_position = (int)lVar8;
      }
      (*pFVar2->_vptr_Fl_Type[0x11])();
      if (write_sourceview != 0) {
        lVar8 = ftell((FILE *)code_file);
        pFVar2->code_position_end = (int)lVar8;
        lVar8 = ftell((FILE *)header_file);
        pFVar2->header_position_end = (int)lVar8;
      }
    }
    iVar5 = fclose((FILE *)code_file);
    code_file = (FILE *)0x0;
    iVar6 = fclose((FILE *)header_file);
    header_file = (FILE *)0x0;
    local_101 = -1 < iVar5 && -1 < iVar6;
    s_local._4_4_ = (uint)local_101;
  }
  return s_local._4_4_;
}

Assistant:

int write_code(const char *s, const char *t) {
  const char *filemode = "w";
  if (write_sourceview) 
    filemode = "wb";
  write_number++;
  delete id_root; id_root = 0;
  indentation = 0;
  current_class = 0L;
  current_widget_class = 0L;
  if (!s) code_file = stdout;
  else {
    FILE *f = fl_fopen(s, filemode);
    if (!f) return 0;
    code_file = f;
  }
  if (!t) header_file = stdout;
  else {
    FILE *f = fl_fopen(t, filemode);
    if (!f) {fclose(code_file); return 0;}
    header_file = f;
  }
  // if the first entry in the Type tree is a comment, then it is probably 
  // a copyright notice. We print that before anything else in the file!
  Fl_Type* first_type = Fl_Type::first;
  if (first_type && first_type->is_comment()) {
    if (write_sourceview) {
      first_type->code_position = (int)ftell(code_file);
      first_type->header_position = (int)ftell(header_file);
    }
    // it is ok to write non-recusive code here, because comments have no children or code2 blocks
    first_type->write_code1();
    if (write_sourceview) {
      first_type->code_position_end = (int)ftell(code_file);
      first_type->header_position_end = (int)ftell(header_file);
    }
    first_type = first_type->next;
  }

  const char *hdr = "\
// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n";
  fprintf(header_file, hdr, FL_VERSION);
  fprintf(code_file, hdr, FL_VERSION);

  {char define_name[102];
  const char* a = fl_filename_name(t);
  char* b = define_name;
  if (!isalpha(*a)) {*b++ = '_';}
  while (*a) {*b++ = isalnum(*a) ? *a : '_'; a++;}
  *b = 0;
  fprintf(header_file, "#ifndef %s\n", define_name);
  fprintf(header_file, "#define %s\n", define_name);
  }  

  write_declare("#include <FL/Fl.H>");
  if (i18n_type && i18n_include[0]) {
    if (i18n_include[0] != '<' &&
        i18n_include[0] != '\"')
      write_c("#include \"%s\"\n", i18n_include);
    else
      write_c("#include %s\n", i18n_include);
    if (i18n_type == 2) {
      if (i18n_file[0]) write_c("extern nl_catd %s;\n", i18n_file);
      else {
        write_c("// Initialize I18N stuff now for menus...\n");
        write_c("#include <locale.h>\n");
	write_c("static char *_locale = setlocale(LC_MESSAGES, \"\");\n");
        write_c("static nl_catd _catalog = catopen(\"%s\", 0);\n",
                   i18n_program);
      }
    }
  }
  if (t && include_H_from_C) {
    if (*header_file_name == '.' && strchr(header_file_name, '/') == NULL) {
      write_c("#include \"%s\"\n", fl_filename_name(t));
    } else {
      write_c("#include \"%s\"\n", t);
    }
  }
  for (Fl_Type* p = first_type; p;) {
    // write all static data for this & all children first
    if (write_sourceview) p->header_position = (int)ftell(header_file);
    p->write_static();
    if (write_sourceview) {
      p->header_position_end = (int)ftell(header_file);
      if (p->header_position==p->header_position_end) p->header_position_end = -1;
    }
    for (Fl_Type* q = p->next; q && q->level > p->level; q = q->next) {
      if (write_sourceview) q->header_position = (int)ftell(header_file);
      q->write_static();
      if (write_sourceview) {
        q->header_position_end = (int)ftell(header_file);
        if (q->header_position==q->header_position_end) q->header_position_end = -1;
      }
    }
    // then write the nested code:
    p = write_code(p);
  }

  delete included_root; included_root = 0;

  if (!s) return 1;

  fprintf(header_file, "#endif\n");

  Fl_Type* last_type = Fl_Type::last;
  if (last_type && last_type->is_comment()) {
    if (write_sourceview) {
      last_type->code_position = (int)ftell(code_file);
      last_type->header_position = (int)ftell(header_file);
    }
    last_type->write_code1();
    if (write_sourceview) {
      last_type->code_position_end = (int)ftell(code_file);
      last_type->header_position_end = (int)ftell(header_file);
    }
  }

  int x = fclose(code_file);
  code_file = 0;
  int y = fclose(header_file);
  header_file = 0;
  return x >= 0 && y >= 0;
}